

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

OutputFile * __thiscall re2c::OutputFile::wu32(OutputFile *this,uint32_t n)

{
  std::ostream::_M_insert<unsigned_long>
            ((ulong)&((this->blocks).
                      super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                     super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]->stream);
  return this;
}

Assistant:

OutputFile & OutputFile::wu32 (uint32_t n)
{
	stream () << n;
	return *this;
}